

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O1

WebPMuxError ChunkAppend(WebPChunk *chunk,WebPChunk ***chunk_list)

{
  uint8_t *puVar1;
  uint32_t uVar2;
  int iVar3;
  WebPChunk *pWVar4;
  WebPChunk *pWVar5;
  WebPChunk **ppWVar6;
  
  ppWVar6 = *chunk_list;
  pWVar5 = *ppWVar6;
  if (pWVar5 == (WebPChunk *)0x0) {
    pWVar5 = (WebPChunk *)WebPSafeMalloc(1,0x20);
    if (pWVar5 != (WebPChunk *)0x0) {
      uVar2 = chunk->tag_;
      iVar3 = chunk->owner_;
      puVar1 = (chunk->data_).bytes;
      pWVar4 = chunk->next_;
      (pWVar5->data_).size = (chunk->data_).size;
      pWVar5->next_ = pWVar4;
      pWVar5->tag_ = uVar2;
      pWVar5->owner_ = iVar3;
      (pWVar5->data_).bytes = puVar1;
      chunk->owner_ = 0;
      pWVar5->next_ = (WebPChunk *)0x0;
      *ppWVar6 = pWVar5;
    }
  }
  else {
    do {
      pWVar4 = pWVar5;
      pWVar5 = pWVar4->next_;
    } while (pWVar5 != (WebPChunk *)0x0);
    ppWVar6 = &pWVar4->next_;
    pWVar5 = (WebPChunk *)WebPSafeMalloc(1,0x20);
    if (pWVar5 != (WebPChunk *)0x0) {
      uVar2 = chunk->tag_;
      iVar3 = chunk->owner_;
      puVar1 = (chunk->data_).bytes;
      pWVar4 = chunk->next_;
      (pWVar5->data_).size = (chunk->data_).size;
      pWVar5->next_ = pWVar4;
      pWVar5->tag_ = uVar2;
      pWVar5->owner_ = iVar3;
      (pWVar5->data_).bytes = puVar1;
      chunk->owner_ = 0;
      pWVar5->next_ = (WebPChunk *)0x0;
      *ppWVar6 = pWVar5;
    }
    *chunk_list = ppWVar6;
  }
  return WEBP_MUX_OK;
}

Assistant:

WebPMuxError ChunkAppend(WebPChunk* const chunk,
                         WebPChunk*** const chunk_list) {
  assert(chunk_list != NULL && *chunk_list != NULL);

  if (**chunk_list == NULL) {
    ChunkSetHead(chunk, *chunk_list);
  } else {
    WebPChunk* last_chunk = **chunk_list;
    while (last_chunk->next_ != NULL) last_chunk = last_chunk->next_;
    ChunkSetHead(chunk, &last_chunk->next_);
    *chunk_list = &last_chunk->next_;
  }
  return WEBP_MUX_OK;
}